

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

shellface * __thiscall tetgenmesh::shellfacetraverse(tetgenmesh *this,memorypool *pool)

{
  shellface *pppdVar1;
  
  do {
    pppdVar1 = (shellface *)memorypool::traverse(pool);
    if (pppdVar1 == (shellface *)0x0) {
      return (shellface *)0x0;
    }
  } while (pppdVar1[3] == (shellface)0x0);
  return pppdVar1;
}

Assistant:

tetgenmesh::shellface* tetgenmesh::shellfacetraverse(memorypool *pool)
{
  shellface *newshellface;

  do {
    newshellface = (shellface *) pool->traverse();
    if (newshellface == (shellface *) NULL) {
      return (shellface *) NULL;
    }
  } while (newshellface[3] == (shellface) NULL);          // Skip dead ones.
  return newshellface;
}